

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interpreter_test.cpp
# Opt level: O0

void __thiscall
InterpreterTestSuite_PC_Active_Test::TestBody(InterpreterTestSuite_PC_Active_Test *this)

{
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *pvVar1;
  undefined8 this_00;
  bool bVar2;
  char *pcVar3;
  element_type *peVar4;
  MockSpec<bool_()> *this_01;
  TypedExpectation<bool_()> *pTVar5;
  CommissionerAppMock *this_02;
  MockSpec<ot::commissioner::Error_(std::shared_ptr<ot::commissioner::CommissionerApp>_&,_const_ot::commissioner::Config_&)>
  *this_03;
  TypedExpectation<ot::commissioner::Error_(std::shared_ptr<ot::commissioner::CommissionerApp>_&,_const_ot::commissioner::Config_&)>
  *this_04;
  TypedExpectation<ot::commissioner::Error_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_unsigned_short)>
  *this_05;
  char *expected_predicate_value;
  string local_f08;
  AssertHelper local_ee8;
  Message local_ee0;
  bool local_ed1;
  undefined1 local_ed0 [8];
  AssertionResult gtest_ar__4;
  allocator local_e71;
  string local_e70;
  Expression local_e50;
  string local_e38;
  AssertHelper local_e18;
  Message local_e10;
  bool local_e01;
  undefined1 local_e00 [8];
  AssertionResult gtest_ar__3;
  allocator local_da1;
  string local_da0;
  Expression local_d80;
  string local_d68;
  AssertHelper local_d48;
  Message local_d40;
  bool local_d31;
  undefined1 local_d30 [8];
  AssertionResult gtest_ar__2;
  allocator local_cd1;
  string local_cd0;
  Expression local_cb0;
  ReturnAction<bool> local_c98;
  Action<bool_()> local_c88;
  ReturnAction<bool> local_c68;
  Action<bool_()> local_c58;
  ReturnAction<bool> local_c38;
  Action<bool_()> local_c28;
  undefined1 local_c01 [17];
  Error local_bf0;
  ReturnAction<ot::commissioner::Error> local_bc8;
  Action<ot::commissioner::Error_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_unsigned_short)>
  local_bb8;
  WithoutMatchers local_b91;
  MockSpec<ot::commissioner::Error_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_unsigned_short)>
  local_b90;
  Error local_b40;
  ReturnAction<ot::commissioner::Error> local_b18;
  anon_class_8_1_567f7a58_for_action local_b08;
  anon_class_8_1_567f7a58_for_action local_b00;
  DoAllAction<testing::internal::WithArgsAction<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_openthread[P]ot_commissioner_src_app_cli_interpreter_test_cpp:1175:36),_0UL>,_testing::internal::ReturnAction<ot::commissioner::Error>_>
  local_af8;
  Action<ot::commissioner::Error_(std::shared_ptr<ot::commissioner::CommissionerApp>_&,_const_ot::commissioner::Config_&)>
  local_ae0;
  WithoutMatchers local_ab9;
  Matcher<const_ot::commissioner::Config_&> local_ab8;
  Matcher<std::shared_ptr<ot::commissioner::CommissionerApp>_&> local_aa0;
  MockSpec<ot::commissioner::Error_(std::shared_ptr<ot::commissioner::CommissionerApp>_&,_const_ot::commissioner::Config_&)>
  local_a88;
  undefined1 local_a50 [8];
  CommissionerAppMockPtr pcaMock;
  AssertHelper local_a20;
  Message local_a18;
  bool local_a09;
  undefined1 local_a08 [8];
  AssertionResult gtest_ar__1;
  allocator local_9a9;
  string local_9a8;
  Expression local_988;
  string local_970;
  AssertHelper local_950;
  Message local_948;
  bool local_939;
  undefined1 local_938 [8];
  AssertionResult gtest_ar_;
  allocator local_8d9;
  string local_8d8;
  Expression local_8b8;
  undefined1 local_8a0 [8];
  Value value;
  Expression expr;
  Action<bool_()> local_830;
  ReturnAction<bool> local_810;
  Action<bool_()> local_800;
  WithoutMatchers local_7d9;
  MockSpec<bool_()> local_7d8;
  AssertHelper local_7c8;
  undefined1 local_7c0 [32];
  string local_7a0;
  allocator local_779;
  string local_778;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_758;
  allocator local_731;
  string local_730;
  Timestamp local_710;
  allocator local_701;
  string local_700;
  allocator local_6d9;
  string local_6d8;
  allocator local_6b1;
  string local_6b0;
  State local_690;
  allocator local_689;
  string local_688;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_668;
  allocator local_641;
  string local_640;
  BorderAgent local_620;
  Status local_4a1;
  undefined1 local_4a0 [8];
  AssertionResult gtest_ar_1;
  AssertHelper local_488;
  Message local_480;
  Status local_471;
  UnixTime local_470;
  allocator local_461;
  string local_460;
  allocator local_439;
  string local_438;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_418;
  allocator local_3f1;
  string local_3f0;
  Timestamp local_3d0;
  allocator local_3c1;
  string local_3c0;
  allocator local_399;
  string local_398;
  allocator local_371;
  string local_370;
  State local_350;
  allocator local_349;
  string local_348;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_328;
  allocator local_301;
  string local_300;
  BorderAgent local_2e0;
  Status local_161;
  undefined1 local_160 [8];
  AssertionResult gtest_ar;
  undefined1 local_140 [8];
  TestContext ctx;
  InterpreterTestSuite_PC_Active_Test *this_local;
  
  ctx.mCommissionerAppStaticExpecter.gmock02_Create_150.super_UntypedFunctionMockerBase.
  untyped_expectations_.
  super__Vector_base<std::shared_ptr<testing::internal::ExpectationBase>,_std::allocator<std::shared_ptr<testing::internal::ExpectationBase>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)this;
  InterpreterTestSuite::TestContext::TestContext((TestContext *)local_140);
  InterpreterTestSuite::InitContext(&this->super_InterpreterTestSuite,(TestContext *)local_140);
  this_00 = ctx.mInterpreter._192_8_;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_300,"127.0.0.1",&local_301);
  local_328.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_328.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_328.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector(&local_328);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_348,"1.1",&local_349);
  ot::commissioner::BorderAgent::State::State(&local_350,0,0,0,0,0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_370,"net1",&local_371);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_398,"",&local_399);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_3c0,"",&local_3c1);
  local_3d0 = (Timestamp)0x0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_3f0,"",&local_3f1);
  local_418.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_418.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_418.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector(&local_418);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_438,"domain1",&local_439);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_460,"",&local_461);
  ot::commissioner::UnixTime::UnixTime(&local_470,0);
  ot::commissioner::BorderAgent::BorderAgent
            (&local_2e0,&local_300,0x4e21,&local_328,&local_348,local_350,&local_370,1,&local_398,
             &local_3c0,local_3d0,0,&local_3f0,&local_418,&local_438,'\0',0,&local_460,local_470,
             0x103f);
  local_161 = ot::commissioner::persistent_storage::Registry::Add((Registry *)this_00,&local_2e0);
  local_471 = kSuccess;
  testing::internal::EqHelper::
  Compare<ot::commissioner::persistent_storage::Registry::Status,_ot::commissioner::persistent_storage::Registry::Status,_nullptr>
            ((EqHelper *)local_160,
             "ctx.mRegistry->Add(BorderAgent{\"127.0.0.1\", 20001, ByteArray{}, \"1.1\", BorderAgent::State{0, 0, 0, 0, 0}, \"net1\", 1, \"\", \"\", Timestamp{0, 0, 0}, 0, \"\", ByteArray{}, \"domain1\", 0, 0, \"\", 0, 0x1F | BorderAgent::kDomainNameBit | BorderAgent::kExtendedPanIdBit})"
             ,"RegistryStatus::kSuccess",&local_161,&local_471);
  ot::commissioner::BorderAgent::~BorderAgent(&local_2e0);
  std::__cxx11::string::~string((string *)&local_460);
  std::allocator<char>::~allocator((allocator<char> *)&local_461);
  std::__cxx11::string::~string((string *)&local_438);
  std::allocator<char>::~allocator((allocator<char> *)&local_439);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector(&local_418);
  std::__cxx11::string::~string((string *)&local_3f0);
  std::allocator<char>::~allocator((allocator<char> *)&local_3f1);
  std::__cxx11::string::~string((string *)&local_3c0);
  std::allocator<char>::~allocator((allocator<char> *)&local_3c1);
  std::__cxx11::string::~string((string *)&local_398);
  std::allocator<char>::~allocator((allocator<char> *)&local_399);
  std::__cxx11::string::~string((string *)&local_370);
  std::allocator<char>::~allocator((allocator<char> *)&local_371);
  std::__cxx11::string::~string((string *)&local_348);
  std::allocator<char>::~allocator((allocator<char> *)&local_349);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector(&local_328);
  std::__cxx11::string::~string((string *)&local_300);
  std::allocator<char>::~allocator((allocator<char> *)&local_301);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_160);
  if (!bVar2) {
    testing::Message::Message(&local_480);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_160);
    testing::internal::AssertHelper::AssertHelper
              (&local_488,kFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/cli/interpreter_test.cpp"
               ,0x480,pcVar3);
    testing::internal::AssertHelper::operator=(&local_488,&local_480);
    testing::internal::AssertHelper::~AssertHelper(&local_488);
    testing::Message::~Message(&local_480);
  }
  gtest_ar_1.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl._5_3_ = 0;
  gtest_ar_1.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl._4_1_ = !bVar2;
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_160);
  if (gtest_ar_1.message_._M_t.
      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
      ._M_head_impl._4_4_ == 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_640,"127.0.0.2",&local_641);
    local_668.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_668.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_668.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector(&local_668);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_688,"1.1",&local_689);
    ot::commissioner::BorderAgent::State::State(&local_690,0,0,0,0,0);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_6b0,"net2",&local_6b1);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_6d8,"",&local_6d9);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_700,"",&local_701);
    local_710 = (Timestamp)0x0;
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_730,"",&local_731);
    local_758.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_758.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_758.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector(&local_758);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_778,"domain1",&local_779);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_7a0,"",(allocator *)(local_7c0 + 0x1f));
    ot::commissioner::UnixTime::UnixTime((UnixTime *)(local_7c0 + 0x10),0);
    expected_predicate_value = (char *)(ulong)(uint)local_690;
    ot::commissioner::BorderAgent::BorderAgent
              (&local_620,&local_640,0x4e21,&local_668,&local_688,local_690,&local_6b0,2,&local_6d8,
               &local_700,local_710,0,&local_730,&local_758,&local_778,'\0',0,&local_7a0,
               (UnixTime)local_7c0._16_8_,0x103f);
    local_4a1 = ot::commissioner::persistent_storage::Registry::Add
                          ((Registry *)ctx.mInterpreter._192_8_,&local_620);
    local_7c0[0xf] = 0;
    pcVar3 = 
    "ctx.mRegistry->Add(BorderAgent{\"127.0.0.2\", 20001, ByteArray{}, \"1.1\", BorderAgent::State{0, 0, 0, 0, 0}, \"net2\", 2, \"\", \"\", Timestamp{0, 0, 0}, 0, \"\", ByteArray{}, \"domain1\", 0, 0, \"\", 0, 0x1F | BorderAgent::kDomainNameBit | BorderAgent::kExtendedPanIdBit})"
    ;
    testing::internal::EqHelper::
    Compare<ot::commissioner::persistent_storage::Registry::Status,_ot::commissioner::persistent_storage::Registry::Status,_nullptr>
              ((EqHelper *)local_4a0,
               "ctx.mRegistry->Add(BorderAgent{\"127.0.0.2\", 20001, ByteArray{}, \"1.1\", BorderAgent::State{0, 0, 0, 0, 0}, \"net2\", 2, \"\", \"\", Timestamp{0, 0, 0}, 0, \"\", ByteArray{}, \"domain1\", 0, 0, \"\", 0, 0x1F | BorderAgent::kDomainNameBit | BorderAgent::kExtendedPanIdBit})"
               ,"RegistryStatus::kSuccess",&local_4a1,local_7c0 + 0xf);
    ot::commissioner::BorderAgent::~BorderAgent(&local_620);
    std::__cxx11::string::~string((string *)&local_7a0);
    std::allocator<char>::~allocator((allocator<char> *)(local_7c0 + 0x1f));
    std::__cxx11::string::~string((string *)&local_778);
    std::allocator<char>::~allocator((allocator<char> *)&local_779);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector(&local_758);
    std::__cxx11::string::~string((string *)&local_730);
    std::allocator<char>::~allocator((allocator<char> *)&local_731);
    std::__cxx11::string::~string((string *)&local_700);
    std::allocator<char>::~allocator((allocator<char> *)&local_701);
    std::__cxx11::string::~string((string *)&local_6d8);
    std::allocator<char>::~allocator((allocator<char> *)&local_6d9);
    std::__cxx11::string::~string((string *)&local_6b0);
    std::allocator<char>::~allocator((allocator<char> *)&local_6b1);
    std::__cxx11::string::~string((string *)&local_688);
    std::allocator<char>::~allocator((allocator<char> *)&local_689);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector(&local_668);
    std::__cxx11::string::~string((string *)&local_640);
    std::allocator<char>::~allocator((allocator<char> *)&local_641);
    bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_4a0);
    if (!bVar2) {
      testing::Message::Message((Message *)local_7c0);
      pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_4a0);
      testing::internal::AssertHelper::AssertHelper
                (&local_7c8,kFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/cli/interpreter_test.cpp"
                 ,0x485,pcVar3);
      pcVar3 = local_7c0;
      testing::internal::AssertHelper::operator=(&local_7c8,(Message *)pcVar3);
      testing::internal::AssertHelper::~AssertHelper(&local_7c8);
      testing::Message::~Message((Message *)local_7c0);
    }
    gtest_ar_1.message_._M_t.
    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
    ._M_head_impl._5_3_ = 0;
    gtest_ar_1.message_._M_t.
    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
    ._M_head_impl._4_1_ = !bVar2;
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_4a0);
    if (gtest_ar_1.message_._M_t.
        super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_t.
        super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        .
        super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
        ._M_head_impl._4_4_ == 0) {
      peVar4 = std::
               __shared_ptr_access<CommissionerAppMock,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator*((__shared_ptr_access<CommissionerAppMock,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)&ctx.mRegistry);
      local_7d8.function_mocker_ =
           (FunctionMocker<bool_()> *)
           CommissionerAppMock::gmock_IsActive
                     ((MockSpec<bool_()> *)peVar4,(CommissionerAppMock *)pcVar3);
      testing::internal::GetWithoutMatchers();
      this_01 = testing::internal::MockSpec<bool_()>::operator()(&local_7d8,&local_7d9,(void *)0x0);
      pTVar5 = testing::internal::MockSpec<bool_()>::InternalExpectedAt
                         (this_01,
                          "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/cli/interpreter_test.cpp"
                          ,0x487,"*ctx.mDefaultCommissionerObject","IsActive()");
      pTVar5 = testing::internal::TypedExpectation<bool_()>::Times(pTVar5,2);
      testing::Return<bool>((testing *)&local_810,false);
      testing::internal::ReturnAction::operator_cast_to_Action
                (&local_800,(ReturnAction *)&local_810);
      pTVar5 = testing::internal::TypedExpectation<bool_()>::WillOnce(pTVar5,&local_800);
      testing::Return<bool>
                ((testing *)
                 &expr.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage,true);
      testing::internal::ReturnAction::operator_cast_to_Action
                (&local_830,
                 (ReturnAction *)
                 &expr.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage);
      testing::internal::TypedExpectation<bool_()>::WillOnce(pTVar5,&local_830);
      testing::Action<bool_()>::~Action(&local_830);
      testing::internal::ReturnAction<bool>::~ReturnAction
                ((ReturnAction<bool> *)
                 &expr.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage);
      testing::Action<bool_()>::~Action(&local_800);
      testing::internal::ReturnAction<bool>::~ReturnAction(&local_810);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)((long)&value.mData.field_2 + 8));
      ot::commissioner::Interpreter::Value::Value((Value *)local_8a0);
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_8d8,"active",&local_8d9);
      ot::commissioner::Interpreter::ParseExpression(&local_8b8,(Interpreter *)local_140,&local_8d8)
      ;
      pvVar1 = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)((long)&value.mData.field_2 + 8);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::operator=(pvVar1,&local_8b8);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&local_8b8);
      std::__cxx11::string::~string((string *)&local_8d8);
      std::allocator<char>::~allocator((allocator<char> *)&local_8d9);
      ot::commissioner::Interpreter::Eval
                ((Value *)&gtest_ar_.message_,(Interpreter *)local_140,pvVar1);
      ot::commissioner::Interpreter::Value::operator=
                ((Value *)local_8a0,(Value *)&gtest_ar_.message_);
      ot::commissioner::Interpreter::Value::~Value((Value *)&gtest_ar_.message_);
      local_939 = ot::commissioner::Interpreter::Value::HasNoError((Value *)local_8a0);
      testing::AssertionResult::AssertionResult<bool>
                ((AssertionResult *)local_938,&local_939,(type *)0x0);
      bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_938);
      if (!bVar2) {
        testing::Message::Message(&local_948);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  (&local_970,(internal *)local_938,(AssertionResult *)0x46a487,"false","true",
                   expected_predicate_value);
        pcVar3 = (char *)std::__cxx11::string::c_str();
        testing::internal::AssertHelper::AssertHelper
                  (&local_950,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/cli/interpreter_test.cpp"
                   ,0x48e,pcVar3);
        testing::internal::AssertHelper::operator=(&local_950,&local_948);
        testing::internal::AssertHelper::~AssertHelper(&local_950);
        std::__cxx11::string::~string((string *)&local_970);
        testing::Message::~Message(&local_948);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)local_938);
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_9a8,"active",&local_9a9);
      ot::commissioner::Interpreter::ParseExpression(&local_988,(Interpreter *)local_140,&local_9a8)
      ;
      pvVar1 = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)((long)&value.mData.field_2 + 8);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::operator=(pvVar1,&local_988);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&local_988);
      std::__cxx11::string::~string((string *)&local_9a8);
      std::allocator<char>::~allocator((allocator<char> *)&local_9a9);
      ot::commissioner::Interpreter::Eval
                ((Value *)&gtest_ar__1.message_,(Interpreter *)local_140,pvVar1);
      ot::commissioner::Interpreter::Value::operator=
                ((Value *)local_8a0,(Value *)&gtest_ar__1.message_);
      ot::commissioner::Interpreter::Value::~Value((Value *)&gtest_ar__1.message_);
      local_a09 = ot::commissioner::Interpreter::Value::HasNoError((Value *)local_8a0);
      testing::AssertionResult::AssertionResult<bool>
                ((AssertionResult *)local_a08,&local_a09,(type *)0x0);
      bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_a08);
      if (!bVar2) {
        testing::Message::Message(&local_a18);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  ((string *)
                   &pcaMock.super___shared_ptr<CommissionerAppMock,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount,(internal *)local_a08,(AssertionResult *)0x46a487,"false","true",
                   expected_predicate_value);
        pcVar3 = (char *)std::__cxx11::string::c_str();
        testing::internal::AssertHelper::AssertHelper
                  (&local_a20,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/cli/interpreter_test.cpp"
                   ,0x493,pcVar3);
        testing::internal::AssertHelper::operator=(&local_a20,&local_a18);
        testing::internal::AssertHelper::~AssertHelper(&local_a20);
        std::__cxx11::string::~string
                  ((string *)
                   &pcaMock.super___shared_ptr<CommissionerAppMock,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount);
        testing::Message::~Message(&local_a18);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)local_a08);
      this_02 = (CommissionerAppMock *)operator_new(0x1838);
      memset(this_02,0,0x1838);
      CommissionerAppMock::CommissionerAppMock(this_02);
      std::shared_ptr<CommissionerAppMock>::shared_ptr<CommissionerAppMock,void>
                ((shared_ptr<CommissionerAppMock> *)local_a50,this_02);
      testing::internal::AnythingMatcher::operator_cast_to_Matcher
                (&local_aa0,(AnythingMatcher *)&testing::_);
      testing::internal::AnythingMatcher::operator_cast_to_Matcher
                (&local_ab8,(AnythingMatcher *)&testing::_);
      CommissionerAppStaticExpecter::gmock_Create
                (&local_a88,
                 (CommissionerAppStaticExpecter *)
                 &ctx.mDefaultCommissionerObject.
                  super___shared_ptr<CommissionerAppMock,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
                 &local_aa0,&local_ab8);
      testing::internal::GetWithoutMatchers();
      this_03 = testing::internal::
                MockSpec<ot::commissioner::Error_(std::shared_ptr<ot::commissioner::CommissionerApp>_&,_const_ot::commissioner::Config_&)>
                ::operator()(&local_a88,&local_ab9,(void *)0x0);
      pcVar3 = "ctx.mCommissionerAppStaticExpecter";
      this_04 = testing::internal::
                MockSpec<ot::commissioner::Error_(std::shared_ptr<ot::commissioner::CommissionerApp>_&,_const_ot::commissioner::Config_&)>
                ::InternalExpectedAt
                          (this_03,
                           "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/cli/interpreter_test.cpp"
                           ,0x496,"ctx.mCommissionerAppStaticExpecter","Create(_, _)");
      local_b08.pcaMock = (CommissionerAppMockPtr *)local_a50;
      local_b00.pcaMock =
           (CommissionerAppMockPtr *)
           testing::WithArg<0ul,InterpreterTestSuite_PC_Active_Test::TestBody()::__0>(&local_b08);
      ot::commissioner::Error::Error(&local_b40);
      testing::Return<ot::commissioner::Error>((testing *)&local_b18,&local_b40);
      testing::
      DoAll<testing::internal::WithArgsAction<InterpreterTestSuite_PC_Active_Test::TestBody()::__0,0ul>,testing::internal::ReturnAction<ot::commissioner::Error>>
                (&local_af8,(testing *)&local_b00,
                 (WithArgsAction<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_openthread[P]ot_commissioner_src_app_cli_interpreter_test_cpp:1175:36),_0UL>
                  *)&local_b18,(ReturnAction<ot::commissioner::Error> *)pcVar3);
      testing::internal::DoAllAction::operator_cast_to_Action(&local_ae0,(DoAllAction *)&local_af8);
      testing::internal::
      TypedExpectation<ot::commissioner::Error_(std::shared_ptr<ot::commissioner::CommissionerApp>_&,_const_ot::commissioner::Config_&)>
      ::WillOnce(this_04,&local_ae0);
      testing::
      Action<ot::commissioner::Error_(std::shared_ptr<ot::commissioner::CommissionerApp>_&,_const_ot::commissioner::Config_&)>
      ::~Action(&local_ae0);
      testing::internal::
      DoAllAction<testing::internal::WithArgsAction<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/cli/interpreter_test.cpp:1175:36),_0UL>,_testing::internal::ReturnAction<ot::commissioner::Error>_>
      ::~DoAllAction(&local_af8);
      testing::internal::ReturnAction<ot::commissioner::Error>::~ReturnAction(&local_b18);
      ot::commissioner::Error::~Error(&local_b40);
      testing::internal::
      MockSpec<ot::commissioner::Error_(std::shared_ptr<ot::commissioner::CommissionerApp>_&,_const_ot::commissioner::Config_&)>
      ::~MockSpec(&local_a88);
      testing::Matcher<const_ot::commissioner::Config_&>::~Matcher(&local_ab8);
      testing::Matcher<std::shared_ptr<ot::commissioner::CommissionerApp>_&>::~Matcher(&local_aa0);
      peVar4 = std::
               __shared_ptr_access<CommissionerAppMock,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator*((__shared_ptr_access<CommissionerAppMock,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)local_a50);
      testing::internal::GetWithoutMatchers();
      CommissionerAppMock::gmock_Start
                (&local_b90,peVar4,&local_b91,
                 (Function<ot::commissioner::Error_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_unsigned_short)>
                  *)0x0);
      pcVar3 = "*pcaMock";
      this_05 = testing::internal::
                MockSpec<ot::commissioner::Error_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_unsigned_short)>
                ::InternalExpectedAt
                          (&local_b90,
                           "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/cli/interpreter_test.cpp"
                           ,0x498,"*pcaMock","Start");
      ot::commissioner::Error::Error(&local_bf0);
      testing::Return<ot::commissioner::Error>((testing *)&local_bc8,&local_bf0);
      testing::internal::ReturnAction::operator_cast_to_Action
                (&local_bb8,(ReturnAction *)&local_bc8);
      testing::internal::
      TypedExpectation<ot::commissioner::Error_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_unsigned_short)>
      ::WillOnce(this_05,&local_bb8);
      testing::
      Action<ot::commissioner::Error_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_unsigned_short)>
      ::~Action(&local_bb8);
      testing::internal::ReturnAction<ot::commissioner::Error>::~ReturnAction(&local_bc8);
      ot::commissioner::Error::~Error(&local_bf0);
      testing::internal::
      MockSpec<ot::commissioner::Error_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_unsigned_short)>
      ::~MockSpec(&local_b90);
      peVar4 = std::
               __shared_ptr_access<CommissionerAppMock,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator*((__shared_ptr_access<CommissionerAppMock,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)local_a50);
      testing::internal::GetWithoutMatchers();
      local_c01._1_8_ =
           CommissionerAppMock::gmock_IsActive
                     ((MockSpec<bool_()> *)peVar4,(CommissionerAppMock *)local_c01,
                      (WithoutMatchers *)0x0,(Function<bool_()> *)pcVar3);
      pTVar5 = testing::internal::MockSpec<bool_()>::InternalExpectedAt
                         ((MockSpec<bool_()> *)(local_c01 + 1),
                          "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/cli/interpreter_test.cpp"
                          ,0x499,"*pcaMock","IsActive");
      pTVar5 = testing::internal::TypedExpectation<bool_()>::Times(pTVar5,3);
      testing::Return<bool>((testing *)&local_c38,false);
      testing::internal::ReturnAction::operator_cast_to_Action
                (&local_c28,(ReturnAction *)&local_c38);
      pTVar5 = testing::internal::TypedExpectation<bool_()>::WillOnce(pTVar5,&local_c28);
      testing::Return<bool>((testing *)&local_c68,true);
      testing::internal::ReturnAction::operator_cast_to_Action
                (&local_c58,(ReturnAction *)&local_c68);
      pTVar5 = testing::internal::TypedExpectation<bool_()>::WillOnce(pTVar5,&local_c58);
      testing::Return<bool>((testing *)&local_c98,false);
      testing::internal::ReturnAction::operator_cast_to_Action
                (&local_c88,(ReturnAction *)&local_c98);
      testing::internal::TypedExpectation<bool_()>::WillOnce(pTVar5,&local_c88);
      testing::Action<bool_()>::~Action(&local_c88);
      testing::internal::ReturnAction<bool>::~ReturnAction(&local_c98);
      testing::Action<bool_()>::~Action(&local_c58);
      testing::internal::ReturnAction<bool>::~ReturnAction(&local_c68);
      testing::Action<bool_()>::~Action(&local_c28);
      testing::internal::ReturnAction<bool>::~ReturnAction(&local_c38);
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_cd0,"start --nwk net1",&local_cd1);
      ot::commissioner::Interpreter::ParseExpression(&local_cb0,(Interpreter *)local_140,&local_cd0)
      ;
      pvVar1 = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)((long)&value.mData.field_2 + 8);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::operator=(pvVar1,&local_cb0);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&local_cb0);
      std::__cxx11::string::~string((string *)&local_cd0);
      std::allocator<char>::~allocator((allocator<char> *)&local_cd1);
      ot::commissioner::Interpreter::Eval
                ((Value *)&gtest_ar__2.message_,(Interpreter *)local_140,pvVar1);
      ot::commissioner::Interpreter::Value::operator=
                ((Value *)local_8a0,(Value *)&gtest_ar__2.message_);
      ot::commissioner::Interpreter::Value::~Value((Value *)&gtest_ar__2.message_);
      local_d31 = ot::commissioner::Interpreter::Value::HasNoError((Value *)local_8a0);
      testing::AssertionResult::AssertionResult<bool>
                ((AssertionResult *)local_d30,&local_d31,(type *)0x0);
      bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_d30);
      if (!bVar2) {
        testing::Message::Message(&local_d40);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  (&local_d68,(internal *)local_d30,(AssertionResult *)0x46a487,"false","true",
                   expected_predicate_value);
        pcVar3 = (char *)std::__cxx11::string::c_str();
        testing::internal::AssertHelper::AssertHelper
                  (&local_d48,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/cli/interpreter_test.cpp"
                   ,0x49c,pcVar3);
        testing::internal::AssertHelper::operator=(&local_d48,&local_d40);
        testing::internal::AssertHelper::~AssertHelper(&local_d48);
        std::__cxx11::string::~string((string *)&local_d68);
        testing::Message::~Message(&local_d40);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)local_d30);
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_da0,"active --nwk net1",&local_da1);
      ot::commissioner::Interpreter::ParseExpression(&local_d80,(Interpreter *)local_140,&local_da0)
      ;
      pvVar1 = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)((long)&value.mData.field_2 + 8);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::operator=(pvVar1,&local_d80);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&local_d80);
      std::__cxx11::string::~string((string *)&local_da0);
      std::allocator<char>::~allocator((allocator<char> *)&local_da1);
      ot::commissioner::Interpreter::Eval
                ((Value *)&gtest_ar__3.message_,(Interpreter *)local_140,pvVar1);
      ot::commissioner::Interpreter::Value::operator=
                ((Value *)local_8a0,(Value *)&gtest_ar__3.message_);
      ot::commissioner::Interpreter::Value::~Value((Value *)&gtest_ar__3.message_);
      local_e01 = ot::commissioner::Interpreter::Value::HasNoError((Value *)local_8a0);
      testing::AssertionResult::AssertionResult<bool>
                ((AssertionResult *)local_e00,&local_e01,(type *)0x0);
      bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_e00);
      if (!bVar2) {
        testing::Message::Message(&local_e10);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  (&local_e38,(internal *)local_e00,(AssertionResult *)0x46a487,"false","true",
                   expected_predicate_value);
        pcVar3 = (char *)std::__cxx11::string::c_str();
        testing::internal::AssertHelper::AssertHelper
                  (&local_e18,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/cli/interpreter_test.cpp"
                   ,0x4a0,pcVar3);
        testing::internal::AssertHelper::operator=(&local_e18,&local_e10);
        testing::internal::AssertHelper::~AssertHelper(&local_e18);
        std::__cxx11::string::~string((string *)&local_e38);
        testing::Message::~Message(&local_e10);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)local_e00);
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_e70,"active --nwk net1",&local_e71);
      ot::commissioner::Interpreter::ParseExpression(&local_e50,(Interpreter *)local_140,&local_e70)
      ;
      pvVar1 = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)((long)&value.mData.field_2 + 8);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::operator=(pvVar1,&local_e50);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&local_e50);
      std::__cxx11::string::~string((string *)&local_e70);
      std::allocator<char>::~allocator((allocator<char> *)&local_e71);
      ot::commissioner::Interpreter::Eval
                ((Value *)&gtest_ar__4.message_,(Interpreter *)local_140,pvVar1);
      ot::commissioner::Interpreter::Value::operator=
                ((Value *)local_8a0,(Value *)&gtest_ar__4.message_);
      ot::commissioner::Interpreter::Value::~Value((Value *)&gtest_ar__4.message_);
      local_ed1 = ot::commissioner::Interpreter::Value::HasNoError((Value *)local_8a0);
      testing::AssertionResult::AssertionResult<bool>
                ((AssertionResult *)local_ed0,&local_ed1,(type *)0x0);
      bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_ed0);
      if (!bVar2) {
        testing::Message::Message(&local_ee0);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  (&local_f08,(internal *)local_ed0,(AssertionResult *)0x46a487,"false","true",
                   expected_predicate_value);
        pcVar3 = (char *)std::__cxx11::string::c_str();
        testing::internal::AssertHelper::AssertHelper
                  (&local_ee8,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/cli/interpreter_test.cpp"
                   ,0x4a4,pcVar3);
        testing::internal::AssertHelper::operator=(&local_ee8,&local_ee0);
        testing::internal::AssertHelper::~AssertHelper(&local_ee8);
        std::__cxx11::string::~string((string *)&local_f08);
        testing::Message::~Message(&local_ee0);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)local_ed0);
      std::shared_ptr<CommissionerAppMock>::~shared_ptr
                ((shared_ptr<CommissionerAppMock> *)local_a50);
      ot::commissioner::Interpreter::Value::~Value((Value *)local_8a0);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)((long)&value.mData.field_2 + 8));
      gtest_ar_1.message_._M_t.
      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
      ._M_head_impl._4_4_ = 0;
    }
  }
  InterpreterTestSuite::TestContext::~TestContext((TestContext *)local_140);
  return;
}

Assistant:

TEST_F(InterpreterTestSuite, PC_Active)
{
    TestContext ctx;
    InitContext(ctx);
    ASSERT_EQ(
        ctx.mRegistry->Add(BorderAgent{"127.0.0.1", 20001, ByteArray{}, "1.1", BorderAgent::State{0, 0, 0, 0, 0},
                                       "net1", 1, "", "", Timestamp{0, 0, 0}, 0, "", ByteArray{}, "domain1", 0, 0, "",
                                       0, 0x1F | BorderAgent::kDomainNameBit | BorderAgent::kExtendedPanIdBit}),
        RegistryStatus::kSuccess);
    ASSERT_EQ(
        ctx.mRegistry->Add(BorderAgent{"127.0.0.2", 20001, ByteArray{}, "1.1", BorderAgent::State{0, 0, 0, 0, 0},
                                       "net2", 2, "", "", Timestamp{0, 0, 0}, 0, "", ByteArray{}, "domain1", 0, 0, "",
                                       0, 0x1F | BorderAgent::kDomainNameBit | BorderAgent::kExtendedPanIdBit}),
        RegistryStatus::kSuccess);

    EXPECT_CALL(*ctx.mDefaultCommissionerObject, IsActive()).Times(2).WillOnce(Return(false)).WillOnce(Return(true));

    Interpreter::Expression expr;
    Interpreter::Value      value;

    expr  = ctx.mInterpreter.ParseExpression("active");
    value = ctx.mInterpreter.Eval(expr);
    EXPECT_TRUE(value.HasNoError());
    // TODO add result verification

    expr  = ctx.mInterpreter.ParseExpression("active");
    value = ctx.mInterpreter.Eval(expr);
    EXPECT_TRUE(value.HasNoError());

    CommissionerAppMockPtr pcaMock{new CommissionerAppMock()};
    EXPECT_CALL(ctx.mCommissionerAppStaticExpecter, Create(_, _))
        .WillOnce(DoAll(WithArg<0>([&](std::shared_ptr<CommissionerApp> &a) { a = pcaMock; }), Return(Error{})));
    EXPECT_CALL(*pcaMock, Start).WillOnce(Return(Error{}));
    EXPECT_CALL(*pcaMock, IsActive).Times(3).WillOnce(Return(false)).WillOnce(Return(true)).WillOnce(Return(false));
    expr  = ctx.mInterpreter.ParseExpression("start --nwk net1");
    value = ctx.mInterpreter.Eval(expr);
    EXPECT_TRUE(value.HasNoError());

    expr  = ctx.mInterpreter.ParseExpression("active --nwk net1");
    value = ctx.mInterpreter.Eval(expr);
    EXPECT_TRUE(value.HasNoError());

    expr  = ctx.mInterpreter.ParseExpression("active --nwk net1");
    value = ctx.mInterpreter.Eval(expr);
    EXPECT_TRUE(value.HasNoError());
}